

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdf.h
# Opt level: O0

int hydro_kdf_derive_from_key
              (uint8_t *subkey,size_t subkey_len,uint64_t subkey_id,char *ctx,uint8_t *key)

{
  int iVar1;
  undefined8 unaff_retaddr;
  hydro_hash_state st;
  size_t in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  hydro_hash_state *in_stack_ffffffffffffffc8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = hydro_hash_init_with_tweak
                    ((hydro_hash_state *)st.state._12_8_,(char *)st.state._4_8_,unaff_retaddr,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == 0) {
    iVar1 = hydro_hash_final(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8);
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
hydro_kdf_derive_from_key(uint8_t *subkey, size_t subkey_len, uint64_t subkey_id,
                          const char    ctx[hydro_kdf_CONTEXTBYTES],
                          const uint8_t key[hydro_kdf_KEYBYTES])
{
    hydro_hash_state st;

    COMPILER_ASSERT(hydro_kdf_CONTEXTBYTES >= hydro_hash_CONTEXTBYTES);
    COMPILER_ASSERT(hydro_kdf_KEYBYTES >= hydro_hash_KEYBYTES);
    if (hydro_hash_init_with_tweak(&st, ctx, subkey_id, key) != 0) {
        return -1;
    }
    return hydro_hash_final(&st, subkey, subkey_len);
}